

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_ppmd7.c
# Opt level: O0

void Ppmd7_Update1(CPpmd7 *p)

{
  long *in_RDI;
  CPpmd_State *s;
  CPpmd7 *in_stack_00000030;
  CPpmd7 *t1;
  CPpmd7 *p_00;
  
  t1 = (CPpmd7 *)in_RDI[2];
  *(Byte *)((long)&t1->MinContext + 1) = *(Byte *)((long)&t1->MinContext + 1) + '\x04';
  *(short *)(*in_RDI + 2) = *(short *)(*in_RDI + 2) + 4;
  p_00 = t1;
  if (*(byte *)((long)t1[-1].BinSumm[0x7f] + 0x7b) < *(Byte *)((long)&t1->MinContext + 1)) {
    SwapStates((CPpmd_State *)t1,(CPpmd_State *)(t1[-1].BinSumm[0x7f] + 0x3d));
    p_00 = (CPpmd7 *)(t1[-1].BinSumm[0x7f] + 0x3d);
    in_RDI[2] = (long)p_00;
    if (0x7c < *(byte *)((long)t1[-1].BinSumm[0x7f] + 0x7b)) {
      Rescale(in_stack_00000030);
    }
  }
  NextContext(p_00);
  return;
}

Assistant:

static void Ppmd7_Update1(CPpmd7 *p)
{
  CPpmd_State *s = p->FoundState;
  s->Freq += 4;
  p->MinContext->SummFreq += 4;
  if (s[0].Freq > s[-1].Freq)
  {
    SwapStates(&s[0], &s[-1]);
    p->FoundState = --s;
    if (s->Freq > MAX_FREQ)
      Rescale(p);
  }
  NextContext(p);
}